

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddUserItem(cmComputeLinkInformation *this,string *item,bool pathNotKnown)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte *string;
  pointer pcVar2;
  char *pcVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  _Alloc_hider _Var7;
  string lib;
  string out;
  Item local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined8 local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  string = (byte *)(item->_M_dataplus)._M_p;
  uVar5 = *string - 0x24;
  if ((uVar5 < 0x3d) && ((0x1000000000000201U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
    lVar6 = std::__cxx11::string::find((char *)item,0x4d3a45,0);
    if ((lVar6 == 0) || (lVar6 = std::__cxx11::string::find((char *)item,0x4d3a41,0), lVar6 == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,item);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    paVar1 = &local_98.Value.field_2;
    pcVar2 = (item->_M_dataplus)._M_p;
    local_98.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,pcVar2 + item->_M_string_length);
    local_98.IsPath = false;
    local_98.Target = (cmGeneratorTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.Value._M_dataplus._M_p == paVar1) {
      return;
    }
    lVar6 = CONCAT71(local_98.Value.field_2._M_allocated_capacity._1_7_,
                     local_98.Value.field_2._M_local_buf[0]);
    _Var7._M_p = local_98.Value._M_dataplus._M_p;
    goto LAB_002f46e1;
  }
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_68 = &local_58;
  bVar4 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,(char *)string);
  if (bVar4) {
    SetCurrentLinkType(this,LinkShared);
    pcVar3 = (this->ExtractSharedLibraryName).startp[2];
    if (pcVar3 == (char *)0x0) {
LAB_002f45a8:
      local_98.Value._M_dataplus._M_p = (pointer)&local_98.Value.field_2;
      local_98.Value._M_string_length = 0;
      local_98.Value.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_98.Value._M_dataplus._M_p = (pointer)&local_98.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pcVar3,(this->ExtractSharedLibraryName).endp[2]);
    }
LAB_002f45f6:
    std::__cxx11::string::operator=((string *)&local_68,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.Value._M_dataplus._M_p != &local_98.Value.field_2) {
      operator_delete(local_98.Value._M_dataplus._M_p,
                      CONCAT71(local_98.Value.field_2._M_allocated_capacity._1_7_,
                               local_98.Value.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    bVar4 = cmsys::RegularExpression::find(&this->ExtractStaticLibraryName,(item->_M_dataplus)._M_p)
    ;
    if (bVar4) {
      SetCurrentLinkType(this,LinkStatic);
      pcVar3 = (this->ExtractStaticLibraryName).startp[2];
      if (pcVar3 == (char *)0x0) goto LAB_002f45a8;
      local_98.Value._M_dataplus._M_p = (pointer)&local_98.Value.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,pcVar3,(this->ExtractStaticLibraryName).endp[2]);
      goto LAB_002f45f6;
    }
    bVar4 = cmsys::RegularExpression::find(&this->ExtractAnyLibraryName,(item->_M_dataplus)._M_p);
    if (bVar4) {
      SetCurrentLinkType(this,this->StartLinkType);
      cmsys::RegularExpression::match_abi_cxx11_(&local_98.Value,&this->ExtractAnyLibraryName,2);
      goto LAB_002f45f6;
    }
    if (pathNotKnown) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldUserFlagItems,item);
    }
    SetCurrentLinkType(this,this->StartLinkType);
    std::__cxx11::string::_M_assign((string *)&local_68);
  }
  pcVar2 = (this->LibLinkFlag)._M_dataplus._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,pcVar2 + (this->LibLinkFlag)._M_string_length);
  std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68);
  std::__cxx11::string::_M_append((char *)&local_48,(ulong)(this->LibLinkSuffix)._M_dataplus._M_p);
  paVar1 = &local_98.Value.field_2;
  local_98.Value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_48,local_40 + (long)local_48);
  local_98.IsPath = false;
  local_98.Target = (cmGeneratorTarget *)0x0;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_98.Value._M_dataplus._M_p,
                    CONCAT71(local_98.Value.field_2._M_allocated_capacity._1_7_,
                             local_98.Value.field_2._M_local_buf[0]) + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_68 == &local_58) {
    return;
  }
  lVar6 = CONCAT71(local_58._M_allocated_capacity._1_7_,local_58._M_local_buf[0]);
  _Var7._M_p = (pointer)local_68;
LAB_002f46e1:
  operator_delete(_Var7._M_p,lVar6 + 1);
  return;
}

Assistant:

void cmComputeLinkInformation::AddUserItem(std::string const& item,
                                           bool pathNotKnown)
{
  // This is called to handle a link item that does not match a CMake
  // target and is not a full path.  We check here if it looks like a
  // library file name to automatically request the proper link type
  // from the linker.  For example:
  //
  //   foo       ==>  -lfoo
  //   libfoo.a  ==>  -Wl,-Bstatic -lfoo

  // Pass flags through untouched.
  if(item[0] == '-' || item[0] == '$' || item[0] == '`')
    {
    // if this is a -l option then we might need to warn about
    // CMP0003 so put it in OldUserFlagItems, if it is not a -l
    // or -Wl,-l (-framework -pthread), then allow it without a
    // CMP0003 as -L will not affect those other linker flags
    if(item.find("-l") == 0 ||  item.find("-Wl,-l") == 0)
      {
      // This is a linker option provided by the user.
      this->OldUserFlagItems.push_back(item);
      }

    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use the item verbatim.
    this->Items.push_back(Item(item, false));
    return;
    }

  // Parse out the prefix, base, and suffix components of the
  // library name.  If the name matches that of a shared or static
  // library then set the link type accordingly.
  //
  // Search for shared library names first because some platforms
  // have shared libraries with names that match the static library
  // pattern.  For example cygwin and msys use the convention
  // libfoo.dll.a for import libraries and libfoo.a for static
  // libraries.  On AIX a library with the name libfoo.a can be
  // shared!
  std::string lib;
  if(this->ExtractSharedLibraryName.find(item))
    {
    // This matches a shared library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex matched [%s] [%s] [%s]\n",
            this->ExtractSharedLibraryName.match(1).c_str(),
            this->ExtractSharedLibraryName.match(2).c_str(),
            this->ExtractSharedLibraryName.match(3).c_str());
#endif
    // Set the link type to shared.
    this->SetCurrentLinkType(LinkShared);

    // Use just the library name so the linker will search.
    lib = this->ExtractSharedLibraryName.match(2);
    }
  else if(this->ExtractStaticLibraryName.find(item))
    {
    // This matches a static library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex matched [%s] [%s] [%s]\n",
            this->ExtractStaticLibraryName.match(1).c_str(),
            this->ExtractStaticLibraryName.match(2).c_str(),
            this->ExtractStaticLibraryName.match(3).c_str());
#endif
    // Set the link type to static.
    this->SetCurrentLinkType(LinkStatic);

    // Use just the library name so the linker will search.
    lib = this->ExtractStaticLibraryName.match(2);
    }
  else if(this->ExtractAnyLibraryName.find(item))
    {
    // This matches a library file name.
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "any regex matched [%s] [%s] [%s]\n",
            this->ExtractAnyLibraryName.match(1).c_str(),
            this->ExtractAnyLibraryName.match(2).c_str(),
            this->ExtractAnyLibraryName.match(3).c_str());
#endif
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);

    // Use just the library name so the linker will search.
    lib = this->ExtractAnyLibraryName.match(2);
    }
  else
    {
    // This is a name specified by the user.
    if(pathNotKnown)
      {
      this->OldUserFlagItems.push_back(item);
      }

    // We must ask the linker to search for a library with this name.
    // Restore the target link type since this item does not specify
    // one.
    this->SetCurrentLinkType(this->StartLinkType);
    lib = item;
    }

  // Create an option to ask the linker to search for the library.
  std::string out = this->LibLinkFlag;
  out += lib;
  out += this->LibLinkSuffix;
  this->Items.push_back(Item(out, false));

  // Here we could try to find the library the linker will find and
  // add a runtime information entry for it.  It would probably not be
  // reliable and we want to encourage use of full paths for library
  // specification.
}